

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_elements_transaction.cpp
# Opt level: O0

ConfidentialTransactionController * __thiscall
cfd::api::ElementsTransactionApi::BlindTransaction
          (ElementsTransactionApi *this,string *tx_hex,
          vector<cfd::api::TxInBlindParameters,_std::allocator<cfd::api::TxInBlindParameters>_>
          *txin_blind_keys,
          vector<cfd::api::TxOutBlindKeys,_std::allocator<cfd::api::TxOutBlindKeys>_>
          *txout_blind_keys,bool is_issuance_blinding)

{
  bool bVar1;
  ConfidentialTransaction *pCVar2;
  size_type sVar3;
  undefined8 uVar4;
  ulong __n;
  reference pvVar5;
  reference pvVar6;
  vector<cfd::api::TxInBlindParameters,_std::allocator<cfd::api::TxInBlindParameters>_> *in_RCX;
  ConfidentialTransactionController *in_RDI;
  vector<cfd::api::TxOutBlindKeys,_std::allocator<cfd::api::TxOutBlindKeys>_> *in_R8;
  byte in_R9B;
  TxOutBlindKeys txout_key;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<cfd::api::TxOutBlindKeys,_std::allocator<cfd::api::TxOutBlindKeys>_> *__range2_1;
  uint32_t index;
  TxInBlindParameters txin_key;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cfd::api::TxInBlindParameters,_std::allocator<cfd::api::TxInBlindParameters>_> *__range2;
  vector<cfd::core::IssuanceBlindingKeyPair,_std::allocator<cfd::core::IssuanceBlindingKeyPair>_>
  issuance_blinding_keys;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> txout_confidential_keys;
  vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> txin_info_list;
  uint32_t txout_count;
  uint32_t txin_count;
  ConfidentialTransactionController *txc;
  Privkey *in_stack_fffffffffffffc38;
  TxInBlindParameters *in_stack_fffffffffffffc40;
  allocator *paVar7;
  string *in_stack_fffffffffffffc48;
  undefined7 in_stack_fffffffffffffc50;
  undefined1 in_stack_fffffffffffffc57;
  TxInBlindParameters *in_stack_fffffffffffffc58;
  CfdError CVar8;
  undefined7 in_stack_fffffffffffffc60;
  undefined1 in_stack_fffffffffffffc67;
  allocator local_2e1;
  string local_2e0 [32];
  CfdSourceLocation local_2c0;
  uint local_2a8 [2];
  TxInBlindParameters local_2a0;
  ConfidentialValue local_1a0;
  byte local_178;
  TxInBlindParameters *local_130;
  __normal_iterator<const_cfd::api::TxInBlindParameters_*,_std::vector<cfd::api::TxInBlindParameters,_std::allocator<cfd::api::TxInBlindParameters>_>_>
  local_128;
  vector<cfd::api::TxInBlindParameters,_std::allocator<cfd::api::TxInBlindParameters>_> *local_120;
  vector<cfd::core::IssuanceBlindingKeyPair,_std::allocator<cfd::core::IssuanceBlindingKeyPair>_>
  local_118;
  allocator_type local_f9;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_f8;
  vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> local_d8;
  undefined1 local_ba;
  allocator local_b9;
  string local_b8 [32];
  CfdSourceLocation local_98;
  undefined1 local_7a;
  allocator local_79;
  string local_78 [32];
  CfdSourceLocation local_58;
  uint32_t local_40;
  uint32_t local_30;
  byte local_2a;
  byte local_29;
  vector<cfd::api::TxOutBlindKeys,_std::allocator<cfd::api::TxOutBlindKeys>_> *local_28;
  vector<cfd::api::TxInBlindParameters,_std::allocator<cfd::api::TxInBlindParameters>_> *local_20;
  
  local_29 = in_R9B & 1;
  local_2a = 0;
  local_28 = in_R8;
  local_20 = in_RCX;
  ConfidentialTransactionController::ConfidentialTransactionController
            ((ConfidentialTransactionController *)
             CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),in_stack_fffffffffffffc48
            );
  pCVar2 = ConfidentialTransactionController::GetTransaction(in_RDI);
  local_30 = core::ConfidentialTransaction::GetTxInCount(pCVar2);
  pCVar2 = ConfidentialTransactionController::GetTransaction(in_RDI);
  local_40 = core::ConfidentialTransaction::GetTxOutCount(pCVar2);
  sVar3 = std::vector<cfd::api::TxInBlindParameters,_std::allocator<cfd::api::TxInBlindParameters>_>
          ::size(local_20);
  if (sVar3 == 0) {
    local_58.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/cfdapi_elements_transaction.cpp"
                 ,0x2f);
    CVar8 = (CfdError)((ulong)in_stack_fffffffffffffc58 >> 0x20);
    local_58.filename = local_58.filename + 1;
    local_58.line = 0x132;
    local_58.funcname = "BlindTransaction";
    core::logger::warn<>(&local_58,"Failed to txins empty.");
    local_7a = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"JSON value error. Empty txins.",&local_79);
    core::CfdException::CfdException
              ((CfdException *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),CVar8,
               (string *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
    local_7a = 0;
    __cxa_throw(uVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  sVar3 = std::vector<cfd::api::TxOutBlindKeys,_std::allocator<cfd::api::TxOutBlindKeys>_>::size
                    (local_28);
  if (sVar3 != 0) {
    std::allocator<cfd::core::UnblindParameter>::allocator
              ((allocator<cfd::core::UnblindParameter> *)0x561652);
    std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::vector
              ((vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> *)
               CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),
               (size_type)in_stack_fffffffffffffc58,
               (allocator_type *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
    std::allocator<cfd::core::UnblindParameter>::~allocator
              ((allocator<cfd::core::UnblindParameter> *)0x56167e);
    __n = (ulong)local_40;
    std::allocator<cfd::core::Pubkey>::allocator((allocator<cfd::core::Pubkey> *)0x56169c);
    std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
              (&local_f8,__n,&local_f9);
    std::allocator<cfd::core::Pubkey>::~allocator((allocator<cfd::core::Pubkey> *)0x5616c2);
    std::
    vector<cfd::core::IssuanceBlindingKeyPair,_std::allocator<cfd::core::IssuanceBlindingKeyPair>_>
    ::vector(&local_118);
    if ((local_29 & 1) != 0) {
      std::
      vector<cfd::core::IssuanceBlindingKeyPair,_std::allocator<cfd::core::IssuanceBlindingKeyPair>_>
      ::resize((vector<cfd::core::IssuanceBlindingKeyPair,_std::allocator<cfd::core::IssuanceBlindingKeyPair>_>
                *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),
               (size_type)in_stack_fffffffffffffc58);
    }
    local_120 = local_20;
    local_128._M_current =
         (TxInBlindParameters *)
         std::vector<cfd::api::TxInBlindParameters,_std::allocator<cfd::api::TxInBlindParameters>_>
         ::begin((vector<cfd::api::TxInBlindParameters,_std::allocator<cfd::api::TxInBlindParameters>_>
                  *)in_stack_fffffffffffffc38);
    local_130 = (TxInBlindParameters *)
                std::
                vector<cfd::api::TxInBlindParameters,_std::allocator<cfd::api::TxInBlindParameters>_>
                ::end((vector<cfd::api::TxInBlindParameters,_std::allocator<cfd::api::TxInBlindParameters>_>
                       *)in_stack_fffffffffffffc38);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_cfd::api::TxInBlindParameters_*,_std::vector<cfd::api::TxInBlindParameters,_std::allocator<cfd::api::TxInBlindParameters>_>_>
                               *)in_stack_fffffffffffffc40,
                              (__normal_iterator<const_cfd::api::TxInBlindParameters_*,_std::vector<cfd::api::TxInBlindParameters,_std::allocator<cfd::api::TxInBlindParameters>_>_>
                               *)in_stack_fffffffffffffc38), bVar1) {
      __gnu_cxx::
      __normal_iterator<const_cfd::api::TxInBlindParameters_*,_std::vector<cfd::api::TxInBlindParameters,_std::allocator<cfd::api::TxInBlindParameters>_>_>
      ::operator*(&local_128);
      TxInBlindParameters::TxInBlindParameters
                ((TxInBlindParameters *)
                 CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),
                 in_stack_fffffffffffffc58);
      pCVar2 = ConfidentialTransactionController::GetTransaction(in_RDI);
      local_2a0.blind_param.abf.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           (*(pCVar2->super_AbstractTransaction)._vptr_AbstractTransaction[2])
                     (pCVar2,&local_2a0.blind_param.vbf,
                      (ulong)(uint)local_2a0.blind_param.value._vptr_ConfidentialValue);
      pvVar5 = std::
               vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::
               operator[](&local_d8,
                          (ulong)local_2a0.blind_param.abf.data_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      core::ConfidentialAssetId::operator=
                (&pvVar5->asset,(ConfidentialAssetId *)&local_2a0.blind_param.value.data_);
      pvVar5 = std::
               vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::
               operator[](&local_d8,
                          (ulong)local_2a0.blind_param.abf.data_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      core::BlindFactor::operator=(&pvVar5->vbf,(BlindFactor *)&local_2a0.issuance_key.token_key);
      pvVar5 = std::
               vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::
               operator[](&local_d8,
                          (ulong)local_2a0.blind_param.abf.data_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      core::BlindFactor::operator=(&pvVar5->abf,(BlindFactor *)&local_2a0.issuance_key);
      pvVar5 = std::
               vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::
               operator[](&local_d8,
                          (ulong)local_2a0.blind_param.abf.data_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      core::ConfidentialValue::operator=(&pvVar5->value,&local_1a0);
      if ((local_178 & 1) != 0) {
        std::
        vector<cfd::core::IssuanceBlindingKeyPair,_std::allocator<cfd::core::IssuanceBlindingKeyPair>_>
        ::operator[](&local_118,
                     (ulong)local_2a0.blind_param.abf.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        core::Privkey::operator=((Privkey *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
        std::
        vector<cfd::core::IssuanceBlindingKeyPair,_std::allocator<cfd::core::IssuanceBlindingKeyPair>_>
        ::operator[](&local_118,
                     (ulong)local_2a0.blind_param.abf.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        core::Privkey::operator=((Privkey *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
      }
      TxInBlindParameters::~TxInBlindParameters(in_stack_fffffffffffffc40);
      __gnu_cxx::
      __normal_iterator<const_cfd::api::TxInBlindParameters_*,_std::vector<cfd::api::TxInBlindParameters,_std::allocator<cfd::api::TxInBlindParameters>_>_>
      ::operator++(&local_128);
    }
    local_2a0.blind_param.abf.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_28;
    local_2a0.blind_param.abf.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)std::vector<cfd::api::TxOutBlindKeys,_std::allocator<cfd::api::TxOutBlindKeys>_>::
                  begin((vector<cfd::api::TxOutBlindKeys,_std::allocator<cfd::api::TxOutBlindKeys>_>
                         *)in_stack_fffffffffffffc38);
    local_2a0.blind_param.abf._vptr_BlindFactor =
         (_func_int **)
         std::vector<cfd::api::TxOutBlindKeys,_std::allocator<cfd::api::TxOutBlindKeys>_>::end
                   ((vector<cfd::api::TxOutBlindKeys,_std::allocator<cfd::api::TxOutBlindKeys>_> *)
                    in_stack_fffffffffffffc38);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_cfd::api::TxOutBlindKeys_*,_std::vector<cfd::api::TxOutBlindKeys,_std::allocator<cfd::api::TxOutBlindKeys>_>_>
                          *)in_stack_fffffffffffffc40,
                         (__normal_iterator<const_cfd::api::TxOutBlindKeys_*,_std::vector<cfd::api::TxOutBlindKeys,_std::allocator<cfd::api::TxOutBlindKeys>_>_>
                          *)in_stack_fffffffffffffc38);
      if (!bVar1) {
        ConfidentialTransactionController::BlindTransaction
                  ((ConfidentialTransactionController *)
                   CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),
                   (vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
                    *)in_stack_fffffffffffffc58,
                   (vector<cfd::core::IssuanceBlindingKeyPair,_std::allocator<cfd::core::IssuanceBlindingKeyPair>_>
                    *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
                   (vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
                   in_stack_fffffffffffffc48);
        local_2a = 1;
        std::
        vector<cfd::core::IssuanceBlindingKeyPair,_std::allocator<cfd::core::IssuanceBlindingKeyPair>_>
        ::~vector(&local_118);
        std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
                  ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
                   CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
        std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::
        ~vector((vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> *
                )CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
        if ((local_2a & 1) == 0) {
          ConfidentialTransactionController::~ConfidentialTransactionController
                    ((ConfidentialTransactionController *)in_stack_fffffffffffffc40);
        }
        return in_RDI;
      }
      __gnu_cxx::
      __normal_iterator<const_cfd::api::TxOutBlindKeys_*,_std::vector<cfd::api::TxOutBlindKeys,_std::allocator<cfd::api::TxOutBlindKeys>_>_>
      ::operator*((__normal_iterator<const_cfd::api::TxOutBlindKeys_*,_std::vector<cfd::api::TxOutBlindKeys,_std::allocator<cfd::api::TxOutBlindKeys>_>_>
                   *)&local_2a0.blind_param.abf.data_);
      TxOutBlindKeys::TxOutBlindKeys
                ((TxOutBlindKeys *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),
                 (TxOutBlindKeys *)in_stack_fffffffffffffc58);
      if (local_40 <= local_2a8[0]) break;
      in_stack_fffffffffffffc67 = core::Pubkey::IsValid((Pubkey *)&local_2a0);
      if ((bool)in_stack_fffffffffffffc67) {
        in_stack_fffffffffffffc58 = &local_2a0;
        pvVar6 = std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::operator[]
                           (&local_f8,(ulong)local_2a8[0]);
        core::Pubkey::operator=(pvVar6,(Pubkey *)in_stack_fffffffffffffc58);
      }
      else {
        in_stack_fffffffffffffc57 =
             core::Pubkey::IsValid
                       ((Pubkey *)
                        &local_2a0.txid.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
        if ((bool)in_stack_fffffffffffffc57) {
          in_stack_fffffffffffffc48 =
               (string *)
               &local_2a0.txid.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
          pvVar6 = std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::operator[]
                             (&local_f8,(ulong)local_2a8[0]);
          core::Pubkey::operator=(pvVar6,(Pubkey *)in_stack_fffffffffffffc48);
        }
      }
      TxOutBlindKeys::~TxOutBlindKeys((TxOutBlindKeys *)in_stack_fffffffffffffc40);
      __gnu_cxx::
      __normal_iterator<const_cfd::api::TxOutBlindKeys_*,_std::vector<cfd::api::TxOutBlindKeys,_std::allocator<cfd::api::TxOutBlindKeys>_>_>
      ::operator++((__normal_iterator<const_cfd::api::TxOutBlindKeys_*,_std::vector<cfd::api::TxOutBlindKeys,_std::allocator<cfd::api::TxOutBlindKeys>_>_>
                    *)&local_2a0.blind_param.abf.data_);
    }
    local_2c0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/cfdapi_elements_transaction.cpp"
                 ,0x2f);
    CVar8 = (CfdError)((ulong)in_stack_fffffffffffffc58 >> 0x20);
    local_2c0.filename = local_2c0.filename + 1;
    local_2c0.line = 0x15d;
    local_2c0.funcname = "BlindTransaction";
    core::logger::warn<unsigned_int&>
              (&local_2c0,"Failed to BlindTransaction. Invalid txout index: {}",local_2a8);
    uVar4 = __cxa_allocate_exception(0x30);
    paVar7 = &local_2e1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2e0,"Invalid txout index.",paVar7);
    core::CfdException::CfdException
              ((CfdException *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),CVar8,
               (string *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
    __cxa_throw(uVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  local_98.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/cfdapi_elements_transaction.cpp"
               ,0x2f);
  CVar8 = (CfdError)((ulong)in_stack_fffffffffffffc58 >> 0x20);
  local_98.filename = local_98.filename + 1;
  local_98.line = 0x137;
  local_98.funcname = "BlindTransaction";
  core::logger::warn<>(&local_98,"Failed to txouts empty.");
  local_ba = 1;
  uVar4 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"JSON value error. Empty txouts.",&local_b9);
  core::CfdException::CfdException
            ((CfdException *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),CVar8,
             (string *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
  local_ba = 0;
  __cxa_throw(uVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

ConfidentialTransactionController ElementsTransactionApi::BlindTransaction(
    const std::string& tx_hex,
    const std::vector<TxInBlindParameters>& txin_blind_keys,
    const std::vector<TxOutBlindKeys>& txout_blind_keys,
    bool is_issuance_blinding) {
  ConfidentialTransactionController txc(tx_hex);

  uint32_t txin_count = txc.GetTransaction().GetTxInCount();
  uint32_t txout_count = txc.GetTransaction().GetTxOutCount();

  if (txin_blind_keys.size() == 0) {
    warn(CFD_LOG_SOURCE, "Failed to txins empty.");
    throw CfdException(
        CfdError::kCfdOutOfRangeError, "JSON value error. Empty txins.");
  }
  if (txout_blind_keys.size() == 0) {
    warn(CFD_LOG_SOURCE, "Failed to txouts empty.");
    throw CfdException(
        CfdError::kCfdOutOfRangeError, "JSON value error. Empty txouts.");
  }

  std::vector<BlindParameter> txin_info_list(txin_count);
  std::vector<Pubkey> txout_confidential_keys(txout_count);
  std::vector<IssuanceBlindingKeyPair> issuance_blinding_keys;
  if (is_issuance_blinding) {
    issuance_blinding_keys.resize(txin_count);
  }

  // TxInのBlind情報設定
  for (TxInBlindParameters txin_key : txin_blind_keys) {
    uint32_t index =
        txc.GetTransaction().GetTxInIndex(txin_key.txid, txin_key.vout);
    txin_info_list[index].asset = txin_key.blind_param.asset;
    txin_info_list[index].vbf = txin_key.blind_param.vbf;
    txin_info_list[index].abf = txin_key.blind_param.abf;
    txin_info_list[index].value = txin_key.blind_param.value;
    if (txin_key.is_issuance) {
      issuance_blinding_keys[index].asset_key =
          txin_key.issuance_key.asset_key;
      issuance_blinding_keys[index].token_key =
          txin_key.issuance_key.token_key;
    }
  }

  // TxOutのBlind情報設定
  for (TxOutBlindKeys txout_key : txout_blind_keys) {
    if (txout_key.index < txout_count) {
      if (txout_key.confidential_key.IsValid()) {
        txout_confidential_keys[txout_key.index] = txout_key.confidential_key;
      } else if (txout_key.blinding_key.IsValid()) {
        txout_confidential_keys[txout_key.index] = txout_key.blinding_key;
      }
    } else {
      warn(
          CFD_LOG_SOURCE,
          "Failed to BlindTransaction. Invalid txout index: {}",
          txout_key.index);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Invalid txout index.");
    }
  }

  txc.BlindTransaction(
      txin_info_list, issuance_blinding_keys, txout_confidential_keys);
  return txc;
}